

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layout.cpp
# Opt level: O0

Position solitaire::Layout::getFoundationPilePosition(PileId *id)

{
  Position PVar1;
  bool bVar2;
  runtime_error *this;
  uint *puVar3;
  PileId *id_local;
  
  bVar2 = boost::operators_impl::operator>=(id,&interfaces::Solitaire::foundationPilesCount);
  if (!bVar2) {
    puVar3 = piles::PileId::operator_cast_to_unsigned_int_(id);
    PVar1.y = 0x1e;
    PVar1.x = *puVar3 * 0x59 + 0x11b;
    return PVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  puVar3 = piles::PileId::operator_cast_to_unsigned_int_(id);
  std::runtime_error::runtime_error(this,"Invalid foundation pile id: " + *puVar3);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Position Layout::getFoundationPilePosition(const piles::PileId id) {
    if (id >= Solitaire::foundationPilesCount)
        throw std::runtime_error {"Invalid foundation pile id: " + id};

    return Position {
        firstFoundationPilePositionX + static_cast<int>(id) * pilesSpacing,
        foundationPilePositionY
    };
}